

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<double>::squeeze(QList<double> *this)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  double *__dest;
  long lVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if (pDVar2 != (Data *)0x0) {
    if ((1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
       ((this->d).size < (pDVar2->super_QArrayData).alloc)) {
      local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      __dest = (double *)QArrayData::allocate(&local_30,8,0x10,(this->d).size,KeepSize);
      pQVar4 = local_30;
      lVar5 = (this->d).size;
      if (lVar5 == 0) {
        lVar5 = 0;
      }
      else {
        memcpy(__dest,(this->d).ptr,lVar5 * 8);
      }
      pQVar3 = &((this->d).d)->super_QArrayData;
      (this->d).d = (Data *)pQVar4;
      (this->d).ptr = __dest;
      (this->d).size = lVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,8,0x10);
        }
      }
    }
    pDVar2 = (this->d).d;
    if (pDVar2 != (Data *)0x0) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}